

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O1

void embree::avx2::
     BVHNIntersectorKHybrid<4,_8,_1,_true,_embree::avx2::ArrayIntersectorK_1<8,_embree::avx2::TriangleMvIntersectorKPluecker<4,_8,_true>_>,_true>
     ::intersect1(Intersectors *This,BVH *bvh,NodeRef root,size_t k,Precalculations *pre,
                 RayHitK<8> *ray,TravRayK<8,_true> *tray,RayQueryContext *context)

{
  undefined4 uVar1;
  uint uVar2;
  uint uVar3;
  ulong uVar4;
  Geometry *pGVar5;
  undefined1 auVar6 [32];
  undefined1 auVar7 [32];
  undefined1 (*pauVar8) [16];
  int iVar9;
  ulong uVar10;
  RayHitK<8> *pRVar11;
  long lVar12;
  Scene *pSVar13;
  ulong uVar14;
  ulong uVar15;
  long lVar16;
  undefined1 (*pauVar17) [16];
  ulong uVar18;
  undefined4 uVar19;
  ulong unaff_R12;
  long lVar20;
  ulong uVar21;
  ulong uVar22;
  long lVar23;
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar31 [16];
  undefined1 auVar30 [16];
  undefined1 auVar32 [32];
  undefined1 auVar33 [64];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar43 [32];
  undefined1 auVar42 [16];
  undefined1 auVar44 [32];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [64];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [64];
  undefined1 auVar83 [64];
  undefined1 auVar84 [16];
  undefined1 auVar85 [64];
  float fVar86;
  float fVar89;
  float fVar90;
  float fVar91;
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  float fVar92;
  float fVar93;
  float fVar94;
  float fVar95;
  float fVar96;
  float fVar97;
  float fVar98;
  float fVar99;
  undefined1 auVar100 [16];
  float fVar101;
  float fVar102;
  float fVar103;
  float fVar104;
  float fVar105;
  float fVar106;
  float fVar107;
  float fVar108;
  float fVar109;
  float fVar110;
  float fVar111;
  float fVar112;
  vbool<4> valid;
  RTCFilterFunctionNArguments args;
  vfloat<4> tNear;
  StackItemT<embree::NodeRefPtr<4>_> stack [244];
  undefined1 local_13c1;
  ulong local_13c0;
  ulong local_13b8;
  undefined1 local_13b0 [16];
  undefined1 local_13a0 [16];
  undefined8 local_1390;
  float fStack_1388;
  float fStack_1384;
  undefined1 local_1380 [16];
  undefined1 local_1370 [16];
  undefined1 local_1360 [16];
  RayHitK<8> *local_1350;
  ulong local_1348;
  undefined1 local_1340 [16];
  ulong local_1330;
  ulong local_1328;
  ulong local_1320;
  ulong local_1318;
  undefined8 *local_1310;
  void *local_1308;
  RTCRayQueryContext *local_1300;
  RayHitK<8> *local_12f8;
  undefined1 (*local_12f0) [32];
  undefined4 local_12e8;
  undefined1 local_12e0 [16];
  float local_12d0;
  float fStack_12cc;
  float fStack_12c8;
  float fStack_12c4;
  undefined1 local_12c0 [16];
  undefined1 local_12b0 [16];
  undefined1 *local_12a0;
  undefined1 local_1290 [16];
  undefined1 local_1280 [16];
  undefined1 local_1270 [16];
  undefined1 local_1260 [16];
  undefined1 local_1250 [16];
  undefined1 local_1240 [16];
  undefined1 local_1230 [16];
  undefined8 local_1220;
  undefined8 uStack_1218;
  undefined8 uStack_1210;
  undefined8 uStack_1208;
  float local_11f0;
  float fStack_11ec;
  float fStack_11e8;
  float fStack_11e4;
  float local_11e0;
  float fStack_11dc;
  float fStack_11d8;
  float fStack_11d4;
  float local_11d0;
  float fStack_11cc;
  float fStack_11c8;
  float fStack_11c4;
  float local_11c0;
  float fStack_11bc;
  float fStack_11b8;
  float fStack_11b4;
  float local_11b0;
  float fStack_11ac;
  float fStack_11a8;
  float fStack_11a4;
  float local_11a0;
  float fStack_119c;
  float fStack_1198;
  float fStack_1194;
  undefined1 local_1190 [16];
  undefined1 local_1180 [16];
  undefined1 local_1170 [16];
  undefined1 local_1160 [16];
  undefined1 local_1150 [16];
  undefined1 local_1140 [16];
  undefined1 local_1130 [16];
  undefined1 local_1120 [16];
  undefined1 local_1110 [16];
  undefined1 local_1100 [16];
  undefined1 local_10f0 [16];
  undefined1 local_10e0 [32];
  undefined1 local_10c0 [32];
  undefined1 local_10a0 [32];
  undefined1 local_1080 [32];
  undefined4 local_1060;
  undefined4 uStack_105c;
  undefined4 uStack_1058;
  undefined4 uStack_1054;
  undefined4 uStack_1050;
  undefined4 uStack_104c;
  undefined4 uStack_1048;
  undefined4 uStack_1044;
  undefined4 local_1040;
  undefined4 uStack_103c;
  undefined4 uStack_1038;
  undefined4 uStack_1034;
  undefined4 uStack_1030;
  undefined4 uStack_102c;
  undefined4 uStack_1028;
  undefined4 uStack_1024;
  undefined4 local_1020;
  undefined4 uStack_101c;
  undefined4 uStack_1018;
  undefined4 uStack_1014;
  undefined4 uStack_1010;
  undefined4 uStack_100c;
  undefined4 uStack_1008;
  undefined4 uStack_1004;
  undefined1 local_1000 [32];
  uint local_fe0;
  uint uStack_fdc;
  uint uStack_fd8;
  uint uStack_fd4;
  uint uStack_fd0;
  uint uStack_fcc;
  uint uStack_fc8;
  uint uStack_fc4;
  uint local_fc0;
  uint uStack_fbc;
  uint uStack_fb8;
  uint uStack_fb4;
  uint uStack_fb0;
  uint uStack_fac;
  uint uStack_fa8;
  uint uStack_fa4;
  size_t local_fa0;
  undefined4 uStack_f98;
  undefined1 local_f90 [3936];
  
  pauVar17 = (undefined1 (*) [16])local_f90;
  local_fa0 = root.ptr;
  uStack_f98 = 0;
  uVar19 = *(undefined4 *)((long)&(tray->org).field_0 + k * 4);
  local_1170._4_4_ = uVar19;
  local_1170._0_4_ = uVar19;
  local_1170._8_4_ = uVar19;
  local_1170._12_4_ = uVar19;
  auVar82 = ZEXT1664(local_1170);
  uVar19 = *(undefined4 *)((long)&(tray->org).field_0 + k * 4 + 0x20);
  local_1180._4_4_ = uVar19;
  local_1180._0_4_ = uVar19;
  local_1180._8_4_ = uVar19;
  local_1180._12_4_ = uVar19;
  auVar83 = ZEXT1664(local_1180);
  uVar19 = *(undefined4 *)((long)&(tray->org).field_0 + k * 4 + 0x40);
  local_1190._4_4_ = uVar19;
  local_1190._0_4_ = uVar19;
  local_1190._8_4_ = uVar19;
  local_1190._12_4_ = uVar19;
  auVar85 = ZEXT1664(local_1190);
  local_11d0 = *(float *)((long)&(tray->rdir).field_0 + k * 4);
  local_11e0 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x20);
  local_11f0 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x40);
  local_11a0 = local_11d0 * 0.99999964;
  local_11b0 = local_11e0 * 0.99999964;
  local_11c0 = local_11f0 * 0.99999964;
  local_11d0 = local_11d0 * 1.0000004;
  local_11e0 = local_11e0 * 1.0000004;
  local_11f0 = local_11f0 * 1.0000004;
  uVar14 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4);
  uVar18 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x20);
  local_1330 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x40);
  local_1318 = uVar14 ^ 0x10;
  local_1320 = uVar18 ^ 0x10;
  local_1328 = local_1330 ^ 0x10;
  iVar9 = (tray->tnear).field_0.i[k];
  local_12e0._4_4_ = iVar9;
  local_12e0._0_4_ = iVar9;
  local_12e0._8_4_ = iVar9;
  local_12e0._12_4_ = iVar9;
  auVar76 = ZEXT1664(local_12e0);
  iVar9 = (tray->tfar).field_0.i[k];
  auVar33 = ZEXT1664(CONCAT412(iVar9,CONCAT48(iVar9,CONCAT44(iVar9,iVar9))));
  iVar9 = 1 << ((uint)k & 0x1f);
  auVar43._4_4_ = iVar9;
  auVar43._0_4_ = iVar9;
  auVar43._8_4_ = iVar9;
  auVar43._12_4_ = iVar9;
  auVar43._16_4_ = iVar9;
  auVar43._20_4_ = iVar9;
  auVar43._24_4_ = iVar9;
  auVar43._28_4_ = iVar9;
  auVar7 = vpmovzxbd_avx2(ZEXT816(0x8040201008040201));
  auVar43 = vpand_avx2(auVar43,auVar7);
  local_10e0 = vpcmpeqd_avx2(auVar43,auVar7);
  fStack_119c = local_11a0;
  fStack_1198 = local_11a0;
  fStack_1194 = local_11a0;
  fStack_11ac = local_11b0;
  fStack_11a8 = local_11b0;
  fStack_11a4 = local_11b0;
  fStack_11bc = local_11c0;
  fStack_11b8 = local_11c0;
  fStack_11b4 = local_11c0;
  fStack_11cc = local_11d0;
  fStack_11c8 = local_11d0;
  fStack_11c4 = local_11d0;
  fStack_11dc = local_11e0;
  fStack_11d8 = local_11e0;
  fStack_11d4 = local_11e0;
  fStack_11ec = local_11f0;
  fStack_11e8 = local_11f0;
  fStack_11e4 = local_11f0;
  uVar10 = local_1330;
  fVar86 = local_11a0;
  fVar89 = local_11a0;
  fVar90 = local_11a0;
  fVar91 = local_11a0;
  fVar92 = local_11b0;
  fVar93 = local_11b0;
  fVar94 = local_11b0;
  fVar95 = local_11b0;
  fVar96 = local_11c0;
  fVar97 = local_11c0;
  fVar98 = local_11c0;
  fVar99 = local_11c0;
  fVar102 = local_11d0;
  fVar104 = local_11d0;
  fVar106 = local_11d0;
  fVar108 = local_11d0;
  fVar101 = local_11e0;
  fVar103 = local_11e0;
  fVar105 = local_11e0;
  fVar107 = local_11e0;
  fVar109 = local_11f0;
  fVar110 = local_11f0;
  fVar111 = local_11f0;
  fVar112 = local_11f0;
  local_13c0 = uVar14;
  local_13b8 = uVar18;
  local_1350 = ray;
  do {
    do {
      do {
        if (pauVar17 == (undefined1 (*) [16])&local_fa0) {
          return;
        }
        pauVar8 = pauVar17 + -1;
        pauVar17 = pauVar17 + -1;
      } while (*(float *)(ray + k * 4 + 0x100) < *(float *)(*pauVar8 + 8));
      uVar22 = *(ulong *)*pauVar17;
      do {
        if ((uVar22 & 8) == 0) {
          auVar35 = vsubps_avx(*(undefined1 (*) [16])(uVar22 + 0x20 + uVar14),auVar82._0_16_);
          auVar34._0_4_ = fVar86 * auVar35._0_4_;
          auVar34._4_4_ = fVar89 * auVar35._4_4_;
          auVar34._8_4_ = fVar90 * auVar35._8_4_;
          auVar34._12_4_ = fVar91 * auVar35._12_4_;
          auVar35 = vsubps_avx(*(undefined1 (*) [16])(uVar22 + 0x20 + uVar18),auVar83._0_16_);
          auVar45._0_4_ = fVar92 * auVar35._0_4_;
          auVar45._4_4_ = fVar93 * auVar35._4_4_;
          auVar45._8_4_ = fVar94 * auVar35._8_4_;
          auVar45._12_4_ = fVar95 * auVar35._12_4_;
          auVar35 = vmaxps_avx(auVar34,auVar45);
          auVar34 = vsubps_avx(*(undefined1 (*) [16])(uVar22 + 0x20 + uVar10),auVar85._0_16_);
          auVar46._0_4_ = fVar96 * auVar34._0_4_;
          auVar46._4_4_ = fVar97 * auVar34._4_4_;
          auVar46._8_4_ = fVar98 * auVar34._8_4_;
          auVar46._12_4_ = fVar99 * auVar34._12_4_;
          auVar34 = vmaxps_avx(auVar46,auVar76._0_16_);
          auVar34 = vmaxps_avx(auVar35,auVar34);
          auVar35 = vsubps_avx(*(undefined1 (*) [16])(uVar22 + 0x20 + local_1318),auVar82._0_16_);
          auVar47._0_4_ = fVar102 * auVar35._0_4_;
          auVar47._4_4_ = fVar104 * auVar35._4_4_;
          auVar47._8_4_ = fVar106 * auVar35._8_4_;
          auVar47._12_4_ = fVar108 * auVar35._12_4_;
          auVar35 = vsubps_avx(*(undefined1 (*) [16])(uVar22 + 0x20 + local_1320),auVar83._0_16_);
          auVar54._0_4_ = fVar101 * auVar35._0_4_;
          auVar54._4_4_ = fVar103 * auVar35._4_4_;
          auVar54._8_4_ = fVar105 * auVar35._8_4_;
          auVar54._12_4_ = fVar107 * auVar35._12_4_;
          auVar35 = vminps_avx(auVar47,auVar54);
          auVar45 = vsubps_avx(*(undefined1 (*) [16])(uVar22 + 0x20 + local_1328),auVar85._0_16_);
          auVar55._0_4_ = fVar109 * auVar45._0_4_;
          auVar55._4_4_ = fVar110 * auVar45._4_4_;
          auVar55._8_4_ = fVar111 * auVar45._8_4_;
          auVar55._12_4_ = fVar112 * auVar45._12_4_;
          auVar45 = vminps_avx(auVar55,auVar33._0_16_);
          auVar35 = vminps_avx(auVar35,auVar45);
          auVar35 = vcmpps_avx(auVar34,auVar35,2);
          uVar19 = vmovmskps_avx(auVar35);
          unaff_R12 = CONCAT44((int)(unaff_R12 >> 0x20),uVar19);
          local_10c0._0_16_ = auVar34;
        }
        if ((uVar22 & 8) == 0) {
          if (unaff_R12 == 0) {
            iVar9 = 4;
          }
          else {
            uVar21 = uVar22 & 0xfffffffffffffff0;
            lVar12 = 0;
            for (uVar22 = unaff_R12; (uVar22 & 1) == 0; uVar22 = uVar22 >> 1 | 0x8000000000000000) {
              lVar12 = lVar12 + 1;
            }
            iVar9 = 0;
            uVar15 = unaff_R12 - 1 & unaff_R12;
            uVar22 = *(ulong *)(uVar21 + lVar12 * 8);
            if (uVar15 != 0) {
              uVar3 = *(uint *)(local_10c0 + lVar12 * 4);
              lVar12 = 0;
              for (uVar14 = uVar15; (uVar14 & 1) == 0; uVar14 = uVar14 >> 1 | 0x8000000000000000) {
                lVar12 = lVar12 + 1;
              }
              uVar15 = uVar15 - 1 & uVar15;
              uVar4 = *(ulong *)(uVar21 + lVar12 * 8);
              uVar2 = *(uint *)(local_10c0 + lVar12 * 4);
              uVar14 = local_13c0;
              uVar18 = local_13b8;
              if (uVar15 == 0) {
                if (uVar3 < uVar2) {
                  *(ulong *)*pauVar17 = uVar4;
                  *(uint *)(*pauVar17 + 8) = uVar2;
                  pauVar17 = pauVar17 + 1;
                }
                else {
                  *(ulong *)*pauVar17 = uVar22;
                  *(uint *)(*pauVar17 + 8) = uVar3;
                  pauVar17 = pauVar17 + 1;
                  uVar22 = uVar4;
                }
              }
              else {
                auVar35._8_8_ = 0;
                auVar35._0_8_ = uVar22;
                auVar35 = vpunpcklqdq_avx(auVar35,ZEXT416(uVar3));
                auVar48._8_8_ = 0;
                auVar48._0_8_ = uVar4;
                auVar34 = vpunpcklqdq_avx(auVar48,ZEXT416(uVar2));
                lVar12 = 0;
                for (uVar22 = uVar15; (uVar22 & 1) == 0; uVar22 = uVar22 >> 1 | 0x8000000000000000)
                {
                  lVar12 = lVar12 + 1;
                }
                uVar15 = uVar15 - 1 & uVar15;
                auVar56._8_8_ = 0;
                auVar56._0_8_ = *(ulong *)(uVar21 + lVar12 * 8);
                auVar46 = vpunpcklqdq_avx(auVar56,ZEXT416(*(uint *)(local_10c0 + lVar12 * 4)));
                auVar45 = vpcmpgtd_avx(auVar34,auVar35);
                if (uVar15 == 0) {
                  auVar47 = vpshufd_avx(auVar45,0xaa);
                  auVar45 = vblendvps_avx(auVar34,auVar35,auVar47);
                  auVar35 = vblendvps_avx(auVar35,auVar34,auVar47);
                  auVar34 = vpcmpgtd_avx(auVar46,auVar45);
                  auVar47 = vpshufd_avx(auVar34,0xaa);
                  auVar34 = vblendvps_avx(auVar46,auVar45,auVar47);
                  auVar45 = vblendvps_avx(auVar45,auVar46,auVar47);
                  auVar46 = vpcmpgtd_avx(auVar45,auVar35);
                  auVar47 = vpshufd_avx(auVar46,0xaa);
                  auVar46 = vblendvps_avx(auVar45,auVar35,auVar47);
                  auVar35 = vblendvps_avx(auVar35,auVar45,auVar47);
                  *pauVar17 = auVar35;
                  pauVar17[1] = auVar46;
                  uVar22 = auVar34._0_8_;
                  pauVar17 = pauVar17 + 2;
                }
                else {
                  lVar12 = 0;
                  for (; (uVar15 & 1) == 0; uVar15 = uVar15 >> 1 | 0x8000000000000000) {
                    lVar12 = lVar12 + 1;
                  }
                  auVar66._8_8_ = 0;
                  auVar66._0_8_ = *(ulong *)(uVar21 + lVar12 * 8);
                  auVar54 = vpunpcklqdq_avx(auVar66,ZEXT416(*(uint *)(local_10c0 + lVar12 * 4)));
                  auVar47 = vpshufd_avx(auVar45,0xaa);
                  auVar45 = vblendvps_avx(auVar34,auVar35,auVar47);
                  auVar35 = vblendvps_avx(auVar35,auVar34,auVar47);
                  auVar34 = vpcmpgtd_avx(auVar54,auVar46);
                  auVar47 = vpshufd_avx(auVar34,0xaa);
                  auVar34 = vblendvps_avx(auVar54,auVar46,auVar47);
                  auVar46 = vblendvps_avx(auVar46,auVar54,auVar47);
                  auVar47 = vpcmpgtd_avx(auVar46,auVar35);
                  auVar54 = vpshufd_avx(auVar47,0xaa);
                  auVar47 = vblendvps_avx(auVar46,auVar35,auVar54);
                  auVar35 = vblendvps_avx(auVar35,auVar46,auVar54);
                  auVar46 = vpcmpgtd_avx(auVar34,auVar45);
                  auVar54 = vpshufd_avx(auVar46,0xaa);
                  auVar46 = vblendvps_avx(auVar34,auVar45,auVar54);
                  auVar34 = vblendvps_avx(auVar45,auVar34,auVar54);
                  auVar45 = vpcmpgtd_avx(auVar47,auVar34);
                  auVar54 = vpshufd_avx(auVar45,0xaa);
                  auVar45 = vblendvps_avx(auVar47,auVar34,auVar54);
                  auVar34 = vblendvps_avx(auVar34,auVar47,auVar54);
                  *pauVar17 = auVar35;
                  pauVar17[1] = auVar34;
                  pauVar17[2] = auVar45;
                  auVar76 = ZEXT1664(local_12e0);
                  uVar22 = auVar46._0_8_;
                  pauVar17 = pauVar17 + 3;
                }
              }
            }
          }
        }
        else {
          iVar9 = 6;
        }
      } while (iVar9 == 0);
    } while (iVar9 != 6);
    lVar12 = (ulong)((uint)uVar22 & 0xf) - 8;
    if (lVar12 != 0) {
      uVar22 = uVar22 & 0xfffffffffffffff0;
      lVar16 = 0;
      local_1348 = unaff_R12;
      do {
        lVar23 = lVar16 * 0xb0;
        uVar19 = *(undefined4 *)(ray + k * 4);
        auVar24._4_4_ = uVar19;
        auVar24._0_4_ = uVar19;
        auVar24._8_4_ = uVar19;
        auVar24._12_4_ = uVar19;
        uVar19 = *(undefined4 *)(ray + k * 4 + 0x20);
        auVar49._4_4_ = uVar19;
        auVar49._0_4_ = uVar19;
        auVar49._8_4_ = uVar19;
        auVar49._12_4_ = uVar19;
        uVar19 = *(undefined4 *)(ray + k * 4 + 0x40);
        auVar57._4_4_ = uVar19;
        auVar57._0_4_ = uVar19;
        auVar57._8_4_ = uVar19;
        auVar57._12_4_ = uVar19;
        auVar45 = vsubps_avx(*(undefined1 (*) [16])(uVar22 + lVar23),auVar24);
        local_1380 = vsubps_avx(*(undefined1 (*) [16])(uVar22 + 0x10 + lVar23),auVar49);
        local_1340 = vsubps_avx(*(undefined1 (*) [16])(uVar22 + 0x20 + lVar23),auVar57);
        auVar35 = vsubps_avx(*(undefined1 (*) [16])(uVar22 + 0x30 + lVar23),auVar24);
        auVar34 = vsubps_avx(*(undefined1 (*) [16])(uVar22 + 0x40 + lVar23),auVar49);
        auVar46 = vsubps_avx(*(undefined1 (*) [16])(uVar22 + 0x50 + lVar23),auVar57);
        auVar47 = vsubps_avx(*(undefined1 (*) [16])(uVar22 + 0x60 + lVar23),auVar24);
        auVar54 = vsubps_avx(*(undefined1 (*) [16])(uVar22 + 0x70 + lVar23),auVar49);
        auVar55 = vsubps_avx(*(undefined1 (*) [16])(uVar22 + 0x80 + lVar23),auVar57);
        local_10f0 = vsubps_avx(auVar47,auVar45);
        local_1110 = vsubps_avx(auVar54,local_1380);
        local_1100 = vsubps_avx(auVar55,local_1340);
        auVar25._0_4_ = auVar45._0_4_ + auVar47._0_4_;
        auVar25._4_4_ = auVar45._4_4_ + auVar47._4_4_;
        auVar25._8_4_ = auVar45._8_4_ + auVar47._8_4_;
        auVar25._12_4_ = auVar45._12_4_ + auVar47._12_4_;
        auVar58._0_4_ = local_1380._0_4_ + auVar54._0_4_;
        auVar58._4_4_ = local_1380._4_4_ + auVar54._4_4_;
        auVar58._8_4_ = local_1380._8_4_ + auVar54._8_4_;
        auVar58._12_4_ = local_1380._12_4_ + auVar54._12_4_;
        fVar102 = local_1340._0_4_;
        auVar61._0_4_ = fVar102 + auVar55._0_4_;
        fVar104 = local_1340._4_4_;
        auVar61._4_4_ = fVar104 + auVar55._4_4_;
        fVar106 = local_1340._8_4_;
        auVar61._8_4_ = fVar106 + auVar55._8_4_;
        fVar108 = local_1340._12_4_;
        auVar61._12_4_ = fVar108 + auVar55._12_4_;
        auVar100._0_4_ = local_1100._0_4_ * auVar58._0_4_;
        auVar100._4_4_ = local_1100._4_4_ * auVar58._4_4_;
        auVar100._8_4_ = local_1100._8_4_ * auVar58._8_4_;
        auVar100._12_4_ = local_1100._12_4_ * auVar58._12_4_;
        auVar56 = vfmsub231ps_fma(auVar100,local_1110,auVar61);
        auVar62._0_4_ = auVar61._0_4_ * local_10f0._0_4_;
        auVar62._4_4_ = auVar61._4_4_ * local_10f0._4_4_;
        auVar62._8_4_ = auVar61._8_4_ * local_10f0._8_4_;
        auVar62._12_4_ = auVar61._12_4_ * local_10f0._12_4_;
        auVar48 = vfmsub231ps_fma(auVar62,local_1100,auVar25);
        auVar26._0_4_ = local_1110._0_4_ * auVar25._0_4_;
        auVar26._4_4_ = local_1110._4_4_ * auVar25._4_4_;
        auVar26._8_4_ = local_1110._8_4_ * auVar25._8_4_;
        auVar26._12_4_ = local_1110._12_4_ * auVar25._12_4_;
        auVar66 = vfmsub231ps_fma(auVar26,local_10f0,auVar58);
        local_1390._4_4_ = *(float *)(ray + k * 4 + 0xc0);
        auVar59._0_4_ = local_1390._4_4_ * auVar66._0_4_;
        auVar59._4_4_ = local_1390._4_4_ * auVar66._4_4_;
        auVar59._8_4_ = local_1390._4_4_ * auVar66._8_4_;
        auVar59._12_4_ = local_1390._4_4_ * auVar66._12_4_;
        uVar19 = *(undefined4 *)(ray + k * 4 + 0xa0);
        auVar84._4_4_ = uVar19;
        auVar84._0_4_ = uVar19;
        auVar84._8_4_ = uVar19;
        auVar84._12_4_ = uVar19;
        auVar48 = vfmadd231ps_fma(auVar59,auVar84,auVar48);
        uVar19 = *(undefined4 *)(ray + k * 4 + 0x80);
        local_13a0._4_4_ = uVar19;
        local_13a0._0_4_ = uVar19;
        local_13a0._8_4_ = uVar19;
        local_13a0._12_4_ = uVar19;
        local_1150 = vfmadd231ps_fma(auVar48,local_13a0,auVar56);
        local_1120 = vsubps_avx(local_1380,auVar34);
        local_1130 = vsubps_avx(local_1340,auVar46);
        auVar67._0_4_ = auVar34._0_4_ + local_1380._0_4_;
        auVar67._4_4_ = auVar34._4_4_ + local_1380._4_4_;
        auVar67._8_4_ = auVar34._8_4_ + local_1380._8_4_;
        auVar67._12_4_ = auVar34._12_4_ + local_1380._12_4_;
        auVar63._0_4_ = fVar102 + auVar46._0_4_;
        auVar63._4_4_ = fVar104 + auVar46._4_4_;
        auVar63._8_4_ = fVar106 + auVar46._8_4_;
        auVar63._12_4_ = fVar108 + auVar46._12_4_;
        fVar86 = local_1130._0_4_;
        auVar70._0_4_ = auVar67._0_4_ * fVar86;
        fVar91 = local_1130._4_4_;
        auVar70._4_4_ = auVar67._4_4_ * fVar91;
        fVar94 = local_1130._8_4_;
        auVar70._8_4_ = auVar67._8_4_ * fVar94;
        fVar97 = local_1130._12_4_;
        auVar70._12_4_ = auVar67._12_4_ * fVar97;
        auVar56 = vfmsub231ps_fma(auVar70,local_1120,auVar63);
        local_1140 = vsubps_avx(auVar45,auVar35);
        fVar89 = local_1140._0_4_;
        auVar77._0_4_ = auVar63._0_4_ * fVar89;
        fVar92 = local_1140._4_4_;
        auVar77._4_4_ = auVar63._4_4_ * fVar92;
        fVar95 = local_1140._8_4_;
        auVar77._8_4_ = auVar63._8_4_ * fVar95;
        fVar98 = local_1140._12_4_;
        auVar77._12_4_ = auVar63._12_4_ * fVar98;
        auVar64._0_4_ = auVar45._0_4_ + auVar35._0_4_;
        auVar64._4_4_ = auVar45._4_4_ + auVar35._4_4_;
        auVar64._8_4_ = auVar45._8_4_ + auVar35._8_4_;
        auVar64._12_4_ = auVar45._12_4_ + auVar35._12_4_;
        auVar48 = vfmsub231ps_fma(auVar77,local_1130,auVar64);
        fVar90 = local_1120._0_4_;
        auVar65._0_4_ = auVar64._0_4_ * fVar90;
        fVar93 = local_1120._4_4_;
        auVar65._4_4_ = auVar64._4_4_ * fVar93;
        fVar96 = local_1120._8_4_;
        auVar65._8_4_ = auVar64._8_4_ * fVar96;
        fVar99 = local_1120._12_4_;
        auVar65._12_4_ = auVar64._12_4_ * fVar99;
        auVar66 = vfmsub231ps_fma(auVar65,local_1140,auVar67);
        auVar27._0_4_ = local_1390._4_4_ * auVar66._0_4_;
        auVar27._4_4_ = local_1390._4_4_ * auVar66._4_4_;
        auVar27._8_4_ = local_1390._4_4_ * auVar66._8_4_;
        auVar27._12_4_ = local_1390._4_4_ * auVar66._12_4_;
        auVar48 = vfmadd231ps_fma(auVar27,auVar84,auVar48);
        local_12c0 = vfmadd231ps_fma(auVar48,local_13a0,auVar56);
        auVar48 = vsubps_avx(auVar35,auVar47);
        auVar71._0_4_ = auVar35._0_4_ + auVar47._0_4_;
        auVar71._4_4_ = auVar35._4_4_ + auVar47._4_4_;
        auVar71._8_4_ = auVar35._8_4_ + auVar47._8_4_;
        auVar71._12_4_ = auVar35._12_4_ + auVar47._12_4_;
        auVar47 = vsubps_avx(auVar34,auVar54);
        auVar50._0_4_ = auVar34._0_4_ + auVar54._0_4_;
        auVar50._4_4_ = auVar34._4_4_ + auVar54._4_4_;
        auVar50._8_4_ = auVar34._8_4_ + auVar54._8_4_;
        auVar50._12_4_ = auVar34._12_4_ + auVar54._12_4_;
        auVar54 = vsubps_avx(auVar46,auVar55);
        auVar36._0_4_ = auVar46._0_4_ + auVar55._0_4_;
        auVar36._4_4_ = auVar46._4_4_ + auVar55._4_4_;
        auVar36._8_4_ = auVar46._8_4_ + auVar55._8_4_;
        auVar36._12_4_ = auVar46._12_4_ + auVar55._12_4_;
        auVar68._0_4_ = auVar54._0_4_ * auVar50._0_4_;
        auVar68._4_4_ = auVar54._4_4_ * auVar50._4_4_;
        auVar68._8_4_ = auVar54._8_4_ * auVar50._8_4_;
        auVar68._12_4_ = auVar54._12_4_ * auVar50._12_4_;
        auVar34 = vfmsub231ps_fma(auVar68,auVar47,auVar36);
        auVar37._0_4_ = auVar36._0_4_ * auVar48._0_4_;
        auVar37._4_4_ = auVar36._4_4_ * auVar48._4_4_;
        auVar37._8_4_ = auVar36._8_4_ * auVar48._8_4_;
        auVar37._12_4_ = auVar36._12_4_ * auVar48._12_4_;
        auVar35 = vfmsub231ps_fma(auVar37,auVar54,auVar71);
        auVar72._0_4_ = auVar47._0_4_ * auVar71._0_4_;
        auVar72._4_4_ = auVar47._4_4_ * auVar71._4_4_;
        auVar72._8_4_ = auVar47._8_4_ * auVar71._8_4_;
        auVar72._12_4_ = auVar47._12_4_ * auVar71._12_4_;
        auVar46 = vfmsub231ps_fma(auVar72,auVar48,auVar50);
        local_1390._0_4_ = local_1390._4_4_;
        fStack_1388 = local_1390._4_4_;
        fStack_1384 = local_1390._4_4_;
        auVar51._0_4_ = local_1390._4_4_ * auVar46._0_4_;
        auVar51._4_4_ = local_1390._4_4_ * auVar46._4_4_;
        auVar51._8_4_ = local_1390._4_4_ * auVar46._8_4_;
        auVar51._12_4_ = local_1390._4_4_ * auVar46._12_4_;
        auVar35 = vfmadd231ps_fma(auVar51,auVar84,auVar35);
        auVar46 = vfmadd231ps_fma(auVar35,local_13a0,auVar34);
        local_12d0 = local_1150._0_4_;
        fStack_12cc = local_1150._4_4_;
        fStack_12c8 = local_1150._8_4_;
        fStack_12c4 = local_1150._12_4_;
        local_12b0._0_4_ = auVar46._0_4_ + local_12c0._0_4_ + local_12d0;
        local_12b0._4_4_ = auVar46._4_4_ + local_12c0._4_4_ + fStack_12cc;
        local_12b0._8_4_ = auVar46._8_4_ + local_12c0._8_4_ + fStack_12c8;
        local_12b0._12_4_ = auVar46._12_4_ + local_12c0._12_4_ + fStack_12c4;
        auVar69._8_4_ = 0x7fffffff;
        auVar69._0_8_ = 0x7fffffff7fffffff;
        auVar69._12_4_ = 0x7fffffff;
        auVar35 = vminps_avx(local_1150,local_12c0);
        auVar35 = vminps_avx(auVar35,auVar46);
        local_1160 = vandps_avx(local_12b0,auVar69);
        auVar78._0_4_ = local_1160._0_4_ * 1.1920929e-07;
        auVar78._4_4_ = local_1160._4_4_ * 1.1920929e-07;
        auVar78._8_4_ = local_1160._8_4_ * 1.1920929e-07;
        auVar78._12_4_ = local_1160._12_4_ * 1.1920929e-07;
        uVar10 = CONCAT44(auVar78._4_4_,auVar78._0_4_);
        auVar73._0_8_ = uVar10 ^ 0x8000000080000000;
        auVar73._8_4_ = -auVar78._8_4_;
        auVar73._12_4_ = -auVar78._12_4_;
        auVar35 = vcmpps_avx(auVar35,auVar73,5);
        auVar34 = vmaxps_avx(local_1150,local_12c0);
        auVar34 = vmaxps_avx(auVar34,auVar46);
        auVar34 = vcmpps_avx(auVar34,auVar78,2);
        local_13b0 = vorps_avx(auVar35,auVar34);
        if ((((local_13b0 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
             (local_13b0 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
            (local_13b0 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
            local_13b0[0xf] < '\0') {
          auVar52._0_4_ = fVar90 * local_1100._0_4_;
          auVar52._4_4_ = fVar93 * local_1100._4_4_;
          auVar52._8_4_ = fVar96 * local_1100._8_4_;
          auVar52._12_4_ = fVar99 * local_1100._12_4_;
          auVar74._0_4_ = fVar89 * local_1110._0_4_;
          auVar74._4_4_ = fVar92 * local_1110._4_4_;
          auVar74._8_4_ = fVar95 * local_1110._8_4_;
          auVar74._12_4_ = fVar98 * local_1110._12_4_;
          auVar46 = vfmsub213ps_fma(local_1110,local_1130,auVar52);
          auVar79._0_4_ = auVar47._0_4_ * fVar86;
          auVar79._4_4_ = auVar47._4_4_ * fVar91;
          auVar79._8_4_ = auVar47._8_4_ * fVar94;
          auVar79._12_4_ = auVar47._12_4_ * fVar97;
          auVar38._0_4_ = fVar89 * auVar54._0_4_;
          auVar38._4_4_ = fVar92 * auVar54._4_4_;
          auVar38._8_4_ = fVar95 * auVar54._8_4_;
          auVar38._12_4_ = fVar98 * auVar54._12_4_;
          auVar54 = vfmsub213ps_fma(auVar54,local_1120,auVar79);
          auVar35 = vandps_avx(auVar52,auVar69);
          auVar34 = vandps_avx(auVar79,auVar69);
          auVar35 = vcmpps_avx(auVar35,auVar34,1);
          local_1250 = vblendvps_avx(auVar54,auVar46,auVar35);
          auVar80._0_4_ = fVar90 * auVar48._0_4_;
          auVar80._4_4_ = fVar93 * auVar48._4_4_;
          auVar80._8_4_ = fVar96 * auVar48._8_4_;
          auVar80._12_4_ = fVar99 * auVar48._12_4_;
          auVar46 = vfmsub213ps_fma(auVar48,local_1130,auVar38);
          auVar87._0_4_ = local_10f0._0_4_ * fVar86;
          auVar87._4_4_ = local_10f0._4_4_ * fVar91;
          auVar87._8_4_ = local_10f0._8_4_ * fVar94;
          auVar87._12_4_ = local_10f0._12_4_ * fVar97;
          auVar54 = vfmsub213ps_fma(local_1100,local_1140,auVar87);
          auVar35 = vandps_avx(auVar87,auVar69);
          auVar34 = vandps_avx(auVar38,auVar69);
          auVar35 = vcmpps_avx(auVar35,auVar34,1);
          local_1240 = vblendvps_avx(auVar46,auVar54,auVar35);
          auVar46 = vfmsub213ps_fma(local_10f0,local_1120,auVar74);
          auVar47 = vfmsub213ps_fma(auVar47,local_1140,auVar80);
          auVar35 = vandps_avx(auVar74,auVar69);
          auVar34 = vandps_avx(auVar80,auVar69);
          auVar35 = vcmpps_avx(auVar35,auVar34,1);
          local_1230 = vblendvps_avx(auVar47,auVar46,auVar35);
          auVar39._0_4_ = local_1230._0_4_ * local_1390._4_4_;
          auVar39._4_4_ = local_1230._4_4_ * local_1390._4_4_;
          auVar39._8_4_ = local_1230._8_4_ * local_1390._4_4_;
          auVar39._12_4_ = local_1230._12_4_ * local_1390._4_4_;
          auVar35 = vfmadd213ps_fma(auVar84,local_1240,auVar39);
          auVar35 = vfmadd213ps_fma(local_13a0,local_1250,auVar35);
          auVar75._0_4_ = auVar35._0_4_ + auVar35._0_4_;
          auVar75._4_4_ = auVar35._4_4_ + auVar35._4_4_;
          auVar75._8_4_ = auVar35._8_4_ + auVar35._8_4_;
          auVar75._12_4_ = auVar35._12_4_ + auVar35._12_4_;
          auVar40._0_4_ = local_1230._0_4_ * fVar102;
          auVar40._4_4_ = local_1230._4_4_ * fVar104;
          auVar40._8_4_ = local_1230._8_4_ * fVar106;
          auVar40._12_4_ = local_1230._12_4_ * fVar108;
          auVar35 = vfmadd213ps_fma(local_1380,local_1240,auVar40);
          auVar34 = vfmadd213ps_fma(auVar45,local_1250,auVar35);
          auVar35 = vrcpps_avx(auVar75);
          auVar88._8_4_ = 0x3f800000;
          auVar88._0_8_ = &DAT_3f8000003f800000;
          auVar88._12_4_ = 0x3f800000;
          auVar45 = vfnmadd213ps_fma(auVar35,auVar75,auVar88);
          auVar35 = vfmadd132ps_fma(auVar45,auVar35,auVar35);
          local_1260._0_4_ = auVar35._0_4_ * (auVar34._0_4_ + auVar34._0_4_);
          local_1260._4_4_ = auVar35._4_4_ * (auVar34._4_4_ + auVar34._4_4_);
          local_1260._8_4_ = auVar35._8_4_ * (auVar34._8_4_ + auVar34._8_4_);
          local_1260._12_4_ = auVar35._12_4_ * (auVar34._12_4_ + auVar34._12_4_);
          auVar33 = ZEXT1664(local_1260);
          uVar19 = *(undefined4 *)(ray + k * 4 + 0x60);
          auVar41._4_4_ = uVar19;
          auVar41._0_4_ = uVar19;
          auVar41._8_4_ = uVar19;
          auVar41._12_4_ = uVar19;
          auVar35 = vcmpps_avx(auVar41,local_1260,2);
          uVar19 = *(undefined4 *)(ray + k * 4 + 0x100);
          auVar81._4_4_ = uVar19;
          auVar81._0_4_ = uVar19;
          auVar81._8_4_ = uVar19;
          auVar81._12_4_ = uVar19;
          auVar34 = vcmpps_avx(local_1260,auVar81,2);
          auVar35 = vandps_avx(auVar35,auVar34);
          auVar34 = local_13b0 & auVar35;
          if ((((auVar34 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
               (auVar34 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              (auVar34 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              auVar34[0xf] < '\0') {
            auVar35 = vandps_avx(auVar35,local_13b0);
            auVar34 = vcmpps_avx(auVar75,_DAT_01feba10,4);
            auVar45 = auVar34 & auVar35;
            if ((((auVar45 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                 (auVar45 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                (auVar45 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                auVar45[0xf] < '\0') {
              local_1360 = vandps_avx(auVar35,auVar34);
              local_12a0 = &local_13c1;
              pSVar13 = context->scene;
              auVar35 = vrcpps_avx(local_12b0);
              auVar60._8_4_ = 0x3f800000;
              auVar60._0_8_ = &DAT_3f8000003f800000;
              auVar60._12_4_ = 0x3f800000;
              auVar34 = vfnmadd213ps_fma(local_12b0,auVar35,auVar60);
              auVar34 = vfmadd132ps_fma(auVar34,auVar35,auVar35);
              auVar53._8_4_ = 0x219392ef;
              auVar53._0_8_ = 0x219392ef219392ef;
              auVar53._12_4_ = 0x219392ef;
              auVar35 = vcmpps_avx(local_1160,auVar53,5);
              auVar35 = vandps_avx(auVar34,auVar35);
              auVar28._0_4_ = local_12d0 * auVar35._0_4_;
              auVar28._4_4_ = fStack_12cc * auVar35._4_4_;
              auVar28._8_4_ = fStack_12c8 * auVar35._8_4_;
              auVar28._12_4_ = fStack_12c4 * auVar35._12_4_;
              local_1280 = vminps_avx(auVar28,auVar60);
              auVar29._0_4_ = local_12c0._0_4_ * auVar35._0_4_;
              auVar29._4_4_ = local_12c0._4_4_ * auVar35._4_4_;
              auVar29._8_4_ = local_12c0._8_4_ * auVar35._8_4_;
              auVar29._12_4_ = local_12c0._12_4_ * auVar35._12_4_;
              local_1270 = vminps_avx(auVar29,auVar60);
              auVar30._8_4_ = 0x7f800000;
              auVar30._0_8_ = 0x7f8000007f800000;
              auVar30._12_4_ = 0x7f800000;
              auVar35 = vblendvps_avx(auVar30,local_1260,local_1360);
              auVar34 = vshufps_avx(auVar35,auVar35,0xb1);
              auVar34 = vminps_avx(auVar34,auVar35);
              auVar45 = vshufpd_avx(auVar34,auVar34,1);
              auVar34 = vminps_avx(auVar45,auVar34);
              auVar34 = vcmpps_avx(auVar35,auVar34,0);
              auVar45 = local_1360 & auVar34;
              auVar35 = local_1360;
              if ((((auVar45 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                   (auVar45 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  (auVar45 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  auVar45[0xf] < '\0') {
                auVar35 = vandps_avx(auVar34,local_1360);
              }
              lVar23 = lVar23 + uVar22;
              uVar19 = vmovmskps_avx(auVar35);
              lVar20 = 0;
              for (uVar10 = CONCAT44((int)((ulong)local_12a0 >> 0x20),uVar19); (uVar10 & 1) == 0;
                  uVar10 = uVar10 >> 1 | 0x8000000000000000) {
                lVar20 = lVar20 + 1;
              }
              local_1390 = pSVar13;
              local_1290 = local_1360;
              do {
                uVar3 = *(uint *)(lVar23 + 0x90 + lVar20 * 4);
                pRVar11 = (RayHitK<8> *)(ulong)uVar3;
                pGVar5 = (pSVar13->geometries).items[(long)pRVar11].ptr;
                if ((pGVar5->mask & *(uint *)(ray + k * 4 + 0x120)) == 0) {
                  *(undefined4 *)(local_1360 + lVar20 * 4) = 0;
                  pSVar13 = local_1390;
                }
                else {
                  if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                     (pGVar5->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                    uVar19 = *(undefined4 *)(local_1280 + lVar20 * 4);
                    uVar1 = *(undefined4 *)(local_1270 + lVar20 * 4);
                    *(undefined4 *)(ray + k * 4 + 0x100) = *(undefined4 *)(local_1260 + lVar20 * 4);
                    *(undefined4 *)(ray + k * 4 + 0x180) = *(undefined4 *)(local_1250 + lVar20 * 4);
                    *(undefined4 *)(ray + k * 4 + 0x1a0) = *(undefined4 *)(local_1240 + lVar20 * 4);
                    *(undefined4 *)(ray + k * 4 + 0x1c0) = *(undefined4 *)(local_1230 + lVar20 * 4);
                    *(undefined4 *)(ray + k * 4 + 0x1e0) = uVar19;
                    *(undefined4 *)(ray + k * 4 + 0x200) = uVar1;
                    *(undefined4 *)(ray + k * 4 + 0x220) =
                         *(undefined4 *)(lVar23 + 0xa0 + lVar20 * 4);
                    *(uint *)(ray + k * 4 + 0x240) = uVar3;
                    *(uint *)(ray + k * 4 + 0x260) = context->user->instID[0];
                    *(uint *)(ray + k * 4 + 0x280) = context->user->instPrimID[0];
                    unaff_R12 = local_1348;
                    break;
                  }
                  local_1060 = *(undefined4 *)(local_1280 + lVar20 * 4);
                  local_1040 = *(undefined4 *)(local_1270 + lVar20 * 4);
                  local_1020 = *(undefined4 *)(lVar23 + 0xa0 + lVar20 * 4);
                  uVar19 = *(undefined4 *)(local_1250 + lVar20 * 4);
                  local_10c0._4_4_ = uVar19;
                  local_10c0._0_4_ = uVar19;
                  local_10c0._8_4_ = uVar19;
                  local_10c0._12_4_ = uVar19;
                  local_10c0._16_4_ = uVar19;
                  local_10c0._20_4_ = uVar19;
                  local_10c0._24_4_ = uVar19;
                  local_10c0._28_4_ = uVar19;
                  uVar19 = *(undefined4 *)(local_1240 + lVar20 * 4);
                  local_10a0._4_4_ = uVar19;
                  local_10a0._0_4_ = uVar19;
                  local_10a0._8_4_ = uVar19;
                  local_10a0._12_4_ = uVar19;
                  local_10a0._16_4_ = uVar19;
                  local_10a0._20_4_ = uVar19;
                  local_10a0._24_4_ = uVar19;
                  local_10a0._28_4_ = uVar19;
                  uVar19 = *(undefined4 *)(local_1230 + lVar20 * 4);
                  local_1080._4_4_ = uVar19;
                  local_1080._0_4_ = uVar19;
                  local_1080._8_4_ = uVar19;
                  local_1080._12_4_ = uVar19;
                  local_1080._16_4_ = uVar19;
                  local_1080._20_4_ = uVar19;
                  local_1080._24_4_ = uVar19;
                  local_1080._28_4_ = uVar19;
                  local_1000._4_4_ = uVar3;
                  local_1000._0_4_ = uVar3;
                  local_1000._8_4_ = uVar3;
                  local_1000._12_4_ = uVar3;
                  local_1000._16_4_ = uVar3;
                  local_1000._20_4_ = uVar3;
                  local_1000._24_4_ = uVar3;
                  local_1000._28_4_ = uVar3;
                  uStack_105c = local_1060;
                  uStack_1058 = local_1060;
                  uStack_1054 = local_1060;
                  uStack_1050 = local_1060;
                  uStack_104c = local_1060;
                  uStack_1048 = local_1060;
                  uStack_1044 = local_1060;
                  uStack_103c = local_1040;
                  uStack_1038 = local_1040;
                  uStack_1034 = local_1040;
                  uStack_1030 = local_1040;
                  uStack_102c = local_1040;
                  uStack_1028 = local_1040;
                  uStack_1024 = local_1040;
                  uStack_101c = local_1020;
                  uStack_1018 = local_1020;
                  uStack_1014 = local_1020;
                  uStack_1010 = local_1020;
                  uStack_100c = local_1020;
                  uStack_1008 = local_1020;
                  uStack_1004 = local_1020;
                  auVar43 = vpcmpeqd_avx2(local_1000,local_1000);
                  uStack_fdc = context->user->instID[0];
                  local_fe0 = uStack_fdc;
                  uStack_fd8 = uStack_fdc;
                  uStack_fd4 = uStack_fdc;
                  uStack_fd0 = uStack_fdc;
                  uStack_fcc = uStack_fdc;
                  uStack_fc8 = uStack_fdc;
                  uStack_fc4 = uStack_fdc;
                  uStack_fbc = context->user->instPrimID[0];
                  local_fc0 = uStack_fbc;
                  uStack_fb8 = uStack_fbc;
                  uStack_fb4 = uStack_fbc;
                  uStack_fb0 = uStack_fbc;
                  uStack_fac = uStack_fbc;
                  uStack_fa8 = uStack_fbc;
                  uStack_fa4 = uStack_fbc;
                  uVar19 = *(undefined4 *)(ray + k * 4 + 0x100);
                  *(undefined4 *)(ray + k * 4 + 0x100) = *(undefined4 *)(local_1260 + lVar20 * 4);
                  local_1220 = local_10e0._0_8_;
                  uStack_1218 = local_10e0._8_8_;
                  uStack_1210 = local_10e0._16_8_;
                  uStack_1208 = local_10e0._24_8_;
                  local_1310 = &local_1220;
                  local_1308 = pGVar5->userPtr;
                  local_1300 = context->user;
                  local_12f0 = &local_10c0;
                  local_12e8 = 8;
                  pRVar11 = (RayHitK<8> *)pGVar5->intersectionFilterN;
                  local_12f8 = ray;
                  if (pRVar11 != (RayHitK<8> *)0x0) {
                    local_13b0._0_8_ = lVar16;
                    local_1340._0_8_ = pauVar17;
                    local_13a0._0_8_ = lVar12;
                    local_1370 = auVar33._0_16_;
                    local_1380._0_4_ = uVar19;
                    auVar43 = ZEXT1632(auVar43._0_16_);
                    pRVar11 = (RayHitK<8> *)(*(code *)pRVar11)(&local_1310);
                    auVar33 = ZEXT1664(local_1370);
                    auVar43 = vpcmpeqd_avx2(auVar43,auVar43);
                    lVar12 = local_13a0._0_8_;
                    uVar14 = local_13c0;
                    lVar16 = local_13b0._0_8_;
                    pauVar17 = (undefined1 (*) [16])local_1340._0_8_;
                    ray = local_1350;
                    uVar18 = local_13b8;
                    uVar19 = local_1380._0_4_;
                  }
                  auVar7._8_8_ = uStack_1218;
                  auVar7._0_8_ = local_1220;
                  auVar7._16_8_ = uStack_1210;
                  auVar7._24_8_ = uStack_1208;
                  auVar32 = vpcmpeqd_avx2(SUB6432(ZEXT1664((undefined1  [16])0x0),0),auVar7);
                  auVar7 = auVar43 & ~auVar32;
                  if ((((((((auVar7 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                           (auVar7 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                          (auVar7 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                         SUB321(auVar7 >> 0x7f,0) == '\0') &&
                        (auVar7 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                       SUB321(auVar7 >> 0xbf,0) == '\0') &&
                      (auVar7 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                      -1 < auVar7[0x1f]) {
                    auVar32 = auVar32 ^ auVar43;
                  }
                  else {
                    pRVar11 = (RayHitK<8> *)context->args->filter;
                    if ((pRVar11 != (RayHitK<8> *)0x0) &&
                       (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                         RTC_RAY_QUERY_FLAG_INCOHERENT ||
                        (((pGVar5->field_8).field_0x2 & 0x40) != 0)))) {
                      local_13b0._0_8_ = lVar16;
                      local_13a0._0_8_ = lVar12;
                      local_1370 = auVar33._0_16_;
                      local_1380._0_4_ = uVar19;
                      auVar43 = ZEXT1632(auVar43._0_16_);
                      pRVar11 = (RayHitK<8> *)(*(code *)pRVar11)(&local_1310);
                      auVar33 = ZEXT1664(local_1370);
                      auVar43 = vpcmpeqd_avx2(auVar43,auVar43);
                      lVar12 = local_13a0._0_8_;
                      uVar14 = local_13c0;
                      lVar16 = local_13b0._0_8_;
                      ray = local_1350;
                      uVar18 = local_13b8;
                      uVar19 = local_1380._0_4_;
                    }
                    auVar32._8_8_ = uStack_1218;
                    auVar32._0_8_ = local_1220;
                    auVar32._16_8_ = uStack_1210;
                    auVar32._24_8_ = uStack_1208;
                    auVar6 = vpcmpeqd_avx2(SUB6432(ZEXT1664((undefined1  [16])0x0),0),auVar32);
                    auVar32 = auVar6 ^ auVar43;
                    auVar7 = auVar43 & ~auVar6;
                    if ((((((((auVar7 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                             (auVar7 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                            (auVar7 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                           SUB321(auVar7 >> 0x7f,0) != '\0') ||
                          (auVar7 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                         SUB321(auVar7 >> 0xbf,0) != '\0') ||
                        (auVar7 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                        auVar7[0x1f] < '\0') {
                      auVar44._0_4_ = auVar6._0_4_ ^ auVar43._0_4_;
                      auVar44._4_4_ = auVar6._4_4_ ^ auVar43._4_4_;
                      auVar44._8_4_ = auVar6._8_4_ ^ auVar43._8_4_;
                      auVar44._12_4_ = auVar6._12_4_ ^ auVar43._12_4_;
                      auVar44._16_4_ = auVar6._16_4_ ^ auVar43._16_4_;
                      auVar44._20_4_ = auVar6._20_4_ ^ auVar43._20_4_;
                      auVar44._24_4_ = auVar6._24_4_ ^ auVar43._24_4_;
                      auVar44._28_4_ = auVar6._28_4_ ^ auVar43._28_4_;
                      auVar43 = vmaskmovps_avx(auVar44,*local_12f0);
                      *(undefined1 (*) [32])(local_12f8 + 0x180) = auVar43;
                      auVar43 = vmaskmovps_avx(auVar44,local_12f0[1]);
                      *(undefined1 (*) [32])(local_12f8 + 0x1a0) = auVar43;
                      auVar43 = vmaskmovps_avx(auVar44,local_12f0[2]);
                      *(undefined1 (*) [32])(local_12f8 + 0x1c0) = auVar43;
                      auVar43 = vmaskmovps_avx(auVar44,local_12f0[3]);
                      *(undefined1 (*) [32])(local_12f8 + 0x1e0) = auVar43;
                      auVar43 = vmaskmovps_avx(auVar44,local_12f0[4]);
                      *(undefined1 (*) [32])(local_12f8 + 0x200) = auVar43;
                      auVar43 = vpmaskmovd_avx2(auVar44,local_12f0[5]);
                      *(undefined1 (*) [32])(local_12f8 + 0x220) = auVar43;
                      auVar43 = vpmaskmovd_avx2(auVar44,local_12f0[6]);
                      *(undefined1 (*) [32])(local_12f8 + 0x240) = auVar43;
                      auVar43 = vpmaskmovd_avx2(auVar44,local_12f0[7]);
                      *(undefined1 (*) [32])(local_12f8 + 0x260) = auVar43;
                      auVar43 = vpmaskmovd_avx2(auVar44,local_12f0[8]);
                      *(undefined1 (*) [32])(local_12f8 + 0x280) = auVar43;
                      pRVar11 = local_12f8;
                    }
                  }
                  if ((((((((auVar32 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                           (auVar32 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                          (auVar32 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                         SUB321(auVar32 >> 0x7f,0) == '\0') &&
                        (auVar32 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                       SUB321(auVar32 >> 0xbf,0) == '\0') &&
                      (auVar32 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                      -1 < auVar32[0x1f]) {
                    *(undefined4 *)(ray + k * 4 + 0x100) = uVar19;
                  }
                  *(undefined4 *)(local_1360 + lVar20 * 4) = 0;
                  uVar19 = *(undefined4 *)(ray + k * 4 + 0x100);
                  auVar31._4_4_ = uVar19;
                  auVar31._0_4_ = uVar19;
                  auVar31._8_4_ = uVar19;
                  auVar31._12_4_ = uVar19;
                  auVar35 = vcmpps_avx(auVar33._0_16_,auVar31,2);
                  local_1360 = vandps_avx(auVar35,local_1360);
                  pSVar13 = local_1390;
                }
                unaff_R12 = local_1348;
                if ((((local_1360 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
                     (local_1360 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                    (local_1360 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                    -1 < local_1360[0xf]) break;
                auVar42._8_4_ = 0x7f800000;
                auVar42._0_8_ = 0x7f8000007f800000;
                auVar42._12_4_ = 0x7f800000;
                auVar35 = vblendvps_avx(auVar42,auVar33._0_16_,local_1360);
                auVar34 = vshufps_avx(auVar35,auVar35,0xb1);
                auVar34 = vminps_avx(auVar34,auVar35);
                auVar45 = vshufpd_avx(auVar34,auVar34,1);
                auVar34 = vminps_avx(auVar45,auVar34);
                auVar34 = vcmpps_avx(auVar35,auVar34,0);
                auVar45 = local_1360 & auVar34;
                auVar35 = local_1360;
                if ((((auVar45 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                     (auVar45 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    (auVar45 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    auVar45[0xf] < '\0') {
                  auVar35 = vandps_avx(auVar34,local_1360);
                }
                uVar19 = vmovmskps_avx(auVar35);
                lVar20 = 0;
                for (uVar10 = CONCAT44((int)((ulong)pRVar11 >> 0x20),uVar19); (uVar10 & 1) == 0;
                    uVar10 = uVar10 >> 1 | 0x8000000000000000) {
                  lVar20 = lVar20 + 1;
                }
              } while( true );
            }
          }
        }
        lVar16 = lVar16 + 1;
      } while (lVar16 != lVar12);
    }
    uVar19 = *(undefined4 *)(ray + k * 4 + 0x100);
    auVar33 = ZEXT1664(CONCAT412(uVar19,CONCAT48(uVar19,CONCAT44(uVar19,uVar19))));
    auVar82 = ZEXT1664(local_1170);
    auVar83 = ZEXT1664(local_1180);
    auVar85 = ZEXT1664(local_1190);
    auVar76 = ZEXT1664(local_12e0);
    uVar10 = local_1330;
    fVar86 = local_11a0;
    fVar89 = fStack_119c;
    fVar90 = fStack_1198;
    fVar91 = fStack_1194;
    fVar92 = local_11b0;
    fVar93 = fStack_11ac;
    fVar94 = fStack_11a8;
    fVar95 = fStack_11a4;
    fVar96 = local_11c0;
    fVar97 = fStack_11bc;
    fVar98 = fStack_11b8;
    fVar99 = fStack_11b4;
    fVar102 = local_11d0;
    fVar104 = fStack_11cc;
    fVar106 = fStack_11c8;
    fVar108 = fStack_11c4;
    fVar101 = local_11e0;
    fVar103 = fStack_11dc;
    fVar105 = fStack_11d8;
    fVar107 = fStack_11d4;
    fVar109 = local_11f0;
    fVar110 = fStack_11ec;
    fVar111 = fStack_11e8;
    fVar112 = fStack_11e4;
  } while( true );
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::intersect1(Accel::Intersectors* This,
                                                                                                const BVH* bvh,
                                                                                                NodeRef root,
                                                                                                size_t k,
                                                                                                Precalculations& pre,
                                                                                                RayHitK<K>& ray,
                                                                                                const TravRayK<K, robust>& tray,
                                                                                                RayQueryContext* context)
    {
      /* stack state */
      StackItemT<NodeRef> stack[stackSizeSingle];  // stack of nodes
      StackItemT<NodeRef>* stackPtr = stack + 1;   // current stack pointer
      StackItemT<NodeRef>* stackEnd = stack + stackSizeSingle;
      stack[0].ptr = root;
      stack[0].dist = neg_inf;

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray1;
      tray1.template init<K>(k, tray.org, tray.dir, tray.rdir, tray.nearXYZ, tray.tnear[k], tray.tfar[k]);

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = NodeRef(stackPtr->ptr);

        /* if popped node is too far, pop next one */
        if (unlikely(*(float*)&stackPtr->dist > ray.tfar[k]))
          continue;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(normal.trav_nodes, 1, 1, 1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray1, ray.time()[k], tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(normal.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          BVHNNodeTraverser1Hit<N, types>::traverseClosestHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(normal.trav_leaves, 1, 1, 1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);

        size_t lazy_node = 0;
        PrimitiveIntersectorK::intersect(This, pre, ray, k, context, prim, num, tray1, lazy_node);

        tray1.tfar = ray.tfar[k];

        if (unlikely(lazy_node)) {
          stackPtr->ptr = lazy_node;
          stackPtr->dist = neg_inf;
          stackPtr++;
        }
      }
    }